

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

MessageProcessingResult __thiscall helics::FederateState::processQueue(FederateState *this)

{
  bool bVar1;
  FederateStates FVar2;
  byte bVar3;
  undefined1 __i;
  bool bVar4;
  FederateStates FVar5;
  action_t aVar6;
  GlobalFederateId GVar7;
  atomic<bool> *in_RDI;
  ActionMessage gError;
  ActionMessage cmd;
  MessageProcessingResult ret_code;
  bool profilerActive;
  bool error_cmd;
  bool initError;
  value_type *in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe40;
  MessageProcessingResult in_stack_fffffffffffffe47;
  memory_order in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  undefined4 in_stack_fffffffffffffe60;
  undefined4 in_stack_fffffffffffffe64;
  undefined4 uVar8;
  GlobalFederateId in_stack_fffffffffffffe68;
  int32_t local_18c;
  GlobalFederateId in_stack_fffffffffffffe78;
  InterfaceHandle in_stack_fffffffffffffe7c;
  GlobalFederateId in_stack_fffffffffffffe80;
  InterfaceHandle in_stack_fffffffffffffe84;
  ActionMessage *in_stack_fffffffffffffeb0;
  FederateState *in_stack_fffffffffffffeb8;
  undefined1 in_stack_ffffffffffffffb7;
  FederateState *in_stack_ffffffffffffffb8;
  MessageProcessingResult local_14;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  FVar2 = std::atomic::operator_cast_to_FederateStates((atomic<helics::FederateStates> *)0x57ae15);
  if (FVar2 == FINISHED) {
    local_14 = HALTED;
  }
  else {
    FVar2 = std::atomic::operator_cast_to_FederateStates((atomic<helics::FederateStates> *)0x57ae34)
    ;
    bVar1 = false;
    bVar3 = in_RDI[0x29e]._M_base._M_i & 1;
    CLI::std::atomic<bool>::store(in_RDI,(bool)in_stack_fffffffffffffe57,in_stack_fffffffffffffe50);
    if (bVar3 != 0) {
      generateProfilingMessage(in_stack_ffffffffffffffb8,(bool)in_stack_ffffffffffffffb7);
    }
    local_14 = processDelayQueue((FederateState *)
                                 CONCAT44(in_stack_fffffffffffffe84.hid,
                                          in_stack_fffffffffffffe80.gid));
    while (__i = returnableResult(local_14), ((__i ^ 0xff) & 1) != 0) {
      gmlc::containers::BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable>::
      pop((BlockingQueue<helics::ActionMessage,_std::mutex,_std::condition_variable> *)
          CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8));
      bVar4 = messageShouldBeDelayed(in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0);
      if (bVar4) {
        std::
        map<helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
        ::operator[]((map<helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
                      *)CONCAT44(in_stack_fffffffffffffe84.hid,in_stack_fffffffffffffe80.gid),
                     (key_type *)
                     CONCAT44(in_stack_fffffffffffffe7c.hid,in_stack_fffffffffffffe78.gid));
        CLI::std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
                  ((deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                   CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                   in_stack_fffffffffffffe38);
      }
      else {
        local_14 = processActionMessage((FederateState *)cmd._24_8_,(ActionMessage *)cmd._16_8_);
        in_stack_fffffffffffffe47 = local_14;
        if (local_14 == DELAY_MESSAGE) {
          in_stack_fffffffffffffe38 =
               (value_type *)
               std::
               map<helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
               ::operator[]((map<helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>,_std::less<helics::GlobalFederateId>,_std::allocator<std::pair<const_helics::GlobalFederateId,_std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffe84.hid,in_stack_fffffffffffffe80.gid)
                            ,(key_type *)
                             CONCAT44(in_stack_fffffffffffffe7c.hid,in_stack_fffffffffffffe78.gid));
          CLI::std::deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_>::push_back
                    ((deque<helics::ActionMessage,_std::allocator<helics::ActionMessage>_> *)
                     CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                     in_stack_fffffffffffffe38);
        }
        if ((local_14 == ERROR_RESULT) &&
           (aVar6 = ActionMessage::action((ActionMessage *)&stack0xffffffffffffff30),
           aVar6 == cmd_global_error)) {
          bVar1 = true;
        }
      }
      ActionMessage::~ActionMessage
                ((ActionMessage *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
    }
    if ((((local_14 == ERROR_RESULT) &&
         (FVar5 = std::atomic::operator_cast_to_FederateStates
                            ((atomic<helics::FederateStates> *)0x57b01b), FVar5 == ERRORED)) &&
        (FVar2 != ERRORED)) && ((!bVar1 && (*(long *)(in_RDI + 0x2a8) != 0)))) {
      ActionMessage::ActionMessage
                ((ActionMessage *)CONCAT44(in_stack_fffffffffffffe64,in_stack_fffffffffffffe60),
                 (action_t)((ulong)in_RDI >> 0x20));
      if ((in_RDI[0x2fd]._M_base._M_i & 1U) == 0) {
        std::unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>::
        operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>
                    *)0x57b092);
        TimeCoordinator::localError((TimeCoordinator *)gError.Te.internalTimeCode);
      }
      else {
        ActionMessage::setAction((ActionMessage *)&stack0xfffffffffffffe70,cmd_global_error);
      }
      GVar7 = std::atomic<helics::GlobalFederateId>::load
                        ((atomic<helics::GlobalFederateId> *)(in_RDI + 0x2c),seq_cst);
      uVar8 = 0;
      GlobalFederateId::GlobalFederateId
                ((GlobalFederateId *)&stack0xfffffffffffffe68,(GlobalBrokerId)0x0);
      local_18c = *(int32_t *)(in_RDI + 0x2a0);
      SmallBuffer::operator=
                ((SmallBuffer *)CONCAT44(GVar7.gid,in_stack_fffffffffffffe68.gid),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(uVar8,in_stack_fffffffffffffe60));
      BrokerBase::addActionMessage
                ((BrokerBase *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),
                 in_stack_fffffffffffffe38);
      ActionMessage::~ActionMessage
                ((ActionMessage *)CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40));
    }
    if (FVar2 == ERRORED) {
      local_14 = ERROR_RESULT;
    }
    CLI::std::atomic<bool>::store(in_RDI,(bool)__i,in_stack_fffffffffffffe50);
    if (bVar3 != 0) {
      generateProfilingMessage(in_stack_ffffffffffffffb8,(bool)in_stack_ffffffffffffffb7);
    }
  }
  return local_14;
}

Assistant:

MessageProcessingResult FederateState::processQueue() noexcept
{
    if (state == FederateStates::FINISHED) {
        return MessageProcessingResult::HALTED;
    }
    auto initError = (state == FederateStates::ERRORED);
    bool error_cmd{false};
    const bool profilerActive{mProfilerActive};
    queueProcessing.store(true);
    if (profilerActive) {
        generateProfilingMessage(true);
    }
    // process the delay Queue first
    auto ret_code = processDelayQueue();

    while (!(returnableResult(ret_code))) {
        auto cmd = queue.pop();
        if (messageShouldBeDelayed(cmd)) {
            delayQueues[cmd.source_id].push_back(cmd);
            continue;
        }
        ret_code = processActionMessage(cmd);

        if (ret_code == MessageProcessingResult::DELAY_MESSAGE) {
            delayQueues[static_cast<GlobalFederateId>(cmd.source_id)].push_back(cmd);
        }
        if (ret_code == MessageProcessingResult::ERROR_RESULT && cmd.action() == CMD_GLOBAL_ERROR) {
            error_cmd = true;
        }
    }

    if (ret_code == MessageProcessingResult::ERROR_RESULT && state == FederateStates::ERRORED) {
        if (!initError && !error_cmd) {
            if (mParent != nullptr) {
                ActionMessage gError(CMD_LOCAL_ERROR);
                if (terminate_on_error) {
                    gError.setAction(CMD_GLOBAL_ERROR);
                } else {
                    timeCoord->localError();
                }
                gError.source_id = global_id.load();
                gError.dest_id = parent_broker_id;
                gError.messageID = errorCode;
                gError.payload = errorString;

                mParent->addActionMessage(std::move(gError));
            }
        }
    }
    if (initError) {
        ret_code = MessageProcessingResult::ERROR_RESULT;
    }
    queueProcessing.store(false);
    if (profilerActive) {
        generateProfilingMessage(false);
    }
    return ret_code;
}